

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O2

string * __thiscall
tcu::TestHierarchyIterator::buildNodePath_abi_cxx11_
          (string *__return_storage_ptr__,TestHierarchyIterator *this,
          vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
          *nodeStack)

{
  size_t ndx;
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar1 = 1; uVar1 < (ulong)(((long)this->m_caseListFilter - (long)this->m_inflater) / 0x28);
      uVar1 = uVar1 + 1) {
    if (1 < uVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestHierarchyIterator::buildNodePath (const vector<NodeIter>& nodeStack)
{
	string nodePath;
	for (size_t ndx = 1; ndx < nodeStack.size(); ndx++)
	{
		const NodeIter& iter = nodeStack[ndx];
		if (ndx > 1) // ignore root package
			nodePath += ".";
		nodePath += iter.node->getName();
	}
	return nodePath;
}